

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

VmConstant *
CreateConstantPointer
          (Allocator *allocator,SynBase *source,int offset,VariableData *container,
          TypeBase *structType,bool trackUsers)

{
  int iVar1;
  Node *pNVar2;
  VmConstant **ppVVar3;
  uint uVar4;
  VmConstant *pVVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  VmConstant *result;
  VmConstant *local_40;
  int local_34;
  undefined4 extraout_var;
  
  if ((structType == (TypeBase *)0x0) ||
     ((structType->typeID != 0xb && (structType->typeID != 0x12)))) {
    __assert_fail("isType<TypeRef>(structType) || isType<TypeNullptr>(structType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                  ,0x61,
                  "VmConstant *CreateConstantPointer(Allocator *, SynBase *, int, VariableData *, TypeBase *, bool)"
                 );
  }
  if (container != (VariableData *)0x0 && trackUsers) {
    uVar4 = (container->offsetUsers).bucketCount;
    uVar6 = uVar4 - 1;
    if (uVar4 != 0) {
      uVar7 = (offset + 1) * -0x61c8864f;
      pNVar2 = (container->offsetUsers).data;
      iVar8 = 0;
      do {
        uVar7 = uVar7 & uVar6;
        iVar1 = pNVar2[uVar7].key;
        if (iVar1 == 0) break;
        if (iVar1 == offset + 1) {
          pVVar5 = pNVar2[uVar7].value;
          if (pVVar5 != (VmConstant *)0x0) {
            return pVVar5;
          }
          break;
        }
        uVar7 = uVar7 + iVar8 + 1;
        iVar8 = iVar8 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  iVar8 = (*allocator->_vptr_Allocator[2])(allocator,0xd8);
  pVVar5 = (VmConstant *)CONCAT44(extraout_var,iVar8);
  (pVVar5->super_VmValue).typeID = 1;
  (pVVar5->super_VmValue).type.type = VM_TYPE_POINTER;
  (pVVar5->super_VmValue).type.size = 8;
  (pVVar5->super_VmValue).type.structType = structType;
  (pVVar5->super_VmValue).source = source;
  (pVVar5->super_VmValue).comment.begin = (char *)0x0;
  (pVVar5->super_VmValue).comment.end = (char *)0x0;
  (pVVar5->super_VmValue).users.allocator = allocator;
  (pVVar5->super_VmValue).users.data = (pVVar5->super_VmValue).users.little;
  (pVVar5->super_VmValue).users.count = 0;
  (pVVar5->super_VmValue).users.max = 8;
  (pVVar5->super_VmValue).hasKnownNonSimpleUse = false;
  (pVVar5->super_VmValue).hasSideEffects = false;
  (pVVar5->super_VmValue).hasMemoryAccess = false;
  (pVVar5->super_VmValue).canBeRemoved = true;
  (pVVar5->super_VmValue).hasKnownSimpleUse = false;
  (pVVar5->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003e8d38;
  pVVar5->dValue = 0.0;
  pVVar5->lValue = 0;
  pVVar5->sValue = (char *)0x0;
  pVVar5->bValue = (VmBlock *)0x0;
  pVVar5->fValue = (VmFunction *)0x0;
  pVVar5->container = (VariableData *)0x0;
  pVVar5->isFloat = false;
  pVVar5->isReference = false;
  pVVar5->iValue = offset;
  pVVar5->container = container;
  local_40 = pVVar5;
  if (container != (VariableData *)0x0 && trackUsers) {
    uVar4 = (container->users).count;
    if (uVar4 == (container->users).max) {
      SmallArray<VmConstant_*,_8U>::grow(&container->users,uVar4);
    }
    ppVVar3 = (container->users).data;
    if (ppVVar3 == (VmConstant **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                   );
    }
    uVar4 = (container->users).count;
    (container->users).count = uVar4 + 1;
    ppVVar3[uVar4] = pVVar5;
    local_34 = offset + 1;
    SmallDenseMap<int,_VmConstant_*,_IntHasher,_8U>::insert
              (&container->offsetUsers,&local_34,&local_40);
  }
  return local_40;
}

Assistant:

VmConstant* CreateConstantPointer(Allocator *allocator, SynBase *source, int offset, VariableData *container, TypeBase *structType, bool trackUsers)
{
	assert(isType<TypeRef>(structType) || isType<TypeNullptr>(structType));

	if(trackUsers && container)
	{
		if(VmConstant **cached = container->offsetUsers.find(offset + 1))
		{
			if (VmConstant *constant = *cached)
				return constant;
		}
	}

	VmConstant *result = new (get<VmConstant>(allocator)) VmConstant(allocator, VmType::Pointer(structType), source);

	result->iValue = offset;
	result->container = container;

	if(trackUsers && container)
	{
		container->users.push_back(result);
		container->offsetUsers.insert(offset + 1, result);
	}

	return result;
}